

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

void __thiscall mir::inst::MirFunction::MirFunction(MirFunction *this,MirFunction *other)

{
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *in_RSI;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *in_RDI;
  
  prelude::Displayable::Displayable((Displayable *)in_RDI,(Displayable *)in_RSI);
  *(undefined ***)&(in_RDI->_M_t)._M_impl = &PTR_display_003704d0;
  std::__cxx11::string::string
            ((string *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header,
             (string *)&(in_RSI->_M_t)._M_impl.super__Rb_tree_header);
  std::shared_ptr<mir::types::FunctionTy>::shared_ptr
            ((shared_ptr<mir::types::FunctionTy> *)in_RSI,
             (shared_ptr<mir::types::FunctionTy> *)in_RDI);
  std::
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  ::map(in_RSI,in_RDI);
  std::
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  ::map((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         *)in_RSI,
        (map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         *)in_RDI);
  return;
}

Assistant:

MirFunction(MirFunction&& other) = default;